

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O1

void __thiscall summarycalc::loaditemtocoverage(summarycalc *this)

{
  char *pcVar1;
  int iVar2;
  long *plVar3;
  FILE *__stream;
  ulong uVar4;
  size_t sVar5;
  undefined8 extraout_RAX;
  long *plVar6;
  int iVar7;
  item itm;
  string file;
  undefined8 local_88;
  long local_80;
  long local_78;
  long lStack_70;
  undefined1 local_68 [32];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  pcVar1 = local_68 + 0x10;
  local_68._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"input/items.bin","");
  if ((this->inputpath_)._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)local_68);
    plVar3 = (long *)std::__cxx11::string::replace
                               ((ulong)local_48,0,(char *)0x0,
                                (ulong)(this->inputpath_)._M_dataplus._M_p);
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_78 = *plVar6;
      lStack_70 = plVar3[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar6;
      local_88 = (long *)*plVar3;
    }
    local_80 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_68,(string *)&local_88);
    if (local_88 != &local_78) {
      operator_delete(local_88);
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  __stream = fopen((char *)local_68._0_8_,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    uVar4 = ftell(__stream);
    fseek(__stream,0,0);
    local_88 = (long *)((ulong)local_88 & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::resize
              (&this->item_to_coverage_,(ulong)((int)((uVar4 & 0xffffffff) / 0x14) + 1),
               (value_type *)&local_88);
    sVar5 = fread(&local_88,0x14,1,__stream);
    if (sVar5 != 0) {
      iVar7 = 0;
      do {
        iVar2 = iVar7 + 1;
        iVar7 = (int)local_88;
        if ((int)local_88 != iVar2) {
          loaditemtocoverage();
          goto LAB_00102e67;
        }
        (this->item_to_coverage_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[(int)local_88] = local_88._4_4_;
        sVar5 = fread(&local_88,0x14,1,__stream);
      } while (sVar5 != 0);
    }
    fclose(__stream);
    if ((char *)local_68._0_8_ != pcVar1) {
      operator_delete((void *)local_68._0_8_);
    }
    return;
  }
LAB_00102e67:
  loaditemtocoverage((summarycalc *)local_68);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if ((char *)local_68._0_8_ != pcVar1) {
    operator_delete((void *)local_68._0_8_);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void summarycalc::loaditemtocoverage()
{
	FILE* fin = NULL;
	std::string file = ITEMS_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	fin = fopen(file.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s cannot open %s\n", __func__, file.c_str());
		exit(EXIT_FAILURE);
	}

	flseek(fin, 0L, SEEK_END);
	long long sz = fltell(fin);
	flseek(fin, 0L, SEEK_SET);
	int last_item_id = 0;
	unsigned int nrec = (unsigned int)sz / (unsigned int)sizeof(item);
	item_to_coverage_.resize(nrec + 1, 0);

	item itm;
	size_t i = fread(&itm, sizeof(itm), 1, fin);
	while (i != 0) {
		last_item_id++;
		if (itm.id != last_item_id) {
			fprintf(stderr, "FATAL: Item ids are not contiguous or do not start from one");
			exit(-1);
		}
		last_item_id = itm.id;
		item_to_coverage_[itm.id] = itm.coverage_id;
		i = fread(&itm, sizeof(itm), 1, fin);
	}
	fclose(fin);

}